

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O1

void __thiscall Portal::draw(Portal *this,Graphics *g)

{
  float dWidth;
  
  if (this->state != CLOSED) {
    piksel::Graphics::push(g);
    piksel::Graphics::imageMode(g,CENTER);
    dWidth = this->scale * 64.0;
    piksel::Animation::draw
              (&this->animation,g,(this->super_AABB).center.field_0.field_0.x - dWidth * 0.5,
               ((this->super_AABB).center.field_0.field_0.y - dWidth * 0.5) + 32.0,dWidth,dWidth,
               false,this->flipVertically,true);
    piksel::Graphics::pop(g);
    return;
  }
  return;
}

Assistant:

void Portal::draw(piksel::Graphics& g) {
    if (state == CLOSED) {
        return;
    }
    g.push();
    g.imageMode(piksel::DrawMode::CENTER);
    animation.draw(g, center.x - scale * PORTAL_WIDTH / 2, center.y - scale * PORTAL_HEIGHT / 2 + PORTAL_HEIGHT / 2, scale * PORTAL_WIDTH, scale * PORTAL_HEIGHT, false, flipVertically, true);
    g.pop();
}